

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int __thiscall
yy::mylanguage_parser::context::expected_tokens(context *this,symbol_kind_type *yyarg,int yyargn)

{
  char cVar1;
  int iVar2;
  int yyx;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  cVar1 = *(char *)((long)&yypact_ +
                   (long)(this->yyparser_->yystack_).seq_.
                         super__Vector_base<yy::mylanguage_parser::stack_symbol_type,_std::allocator<yy::mylanguage_parser::stack_symbol_type>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].
                         super_basic_symbol<yy::mylanguage_parser::by_state>.super_by_state.state);
  iVar4 = (int)cVar1;
  if (iVar4 == -1) {
    iVar2 = 0;
  }
  else {
    iVar3 = -iVar4;
    if (-1 < cVar1) {
      iVar3 = 0;
    }
    iVar2 = 0;
    iVar5 = 0x22;
    if (1 - iVar4 < 0x22) {
      iVar2 = 0;
      iVar5 = 1 - iVar4;
    }
    for (; iVar3 < iVar5; iVar3 = iVar3 + 1) {
      if (iVar3 == 0) {
        if (yyarg == (symbol_kind_type *)0x0) {
          iVar2 = iVar2 + 1;
        }
        else {
          if (iVar2 == yyargn) goto LAB_0010a724;
          lVar6 = (long)iVar2;
          iVar2 = iVar2 + 1;
          yyarg[lVar6] = S_YYEOF;
        }
      }
    }
  }
  if (((0 < yyargn) && (yyarg != (symbol_kind_type *)0x0)) && (iVar2 == 0)) {
    *yyarg = S_YYEMPTY;
LAB_0010a724:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
  mylanguage_parser::context::expected_tokens (symbol_kind_type yyarg[], int yyargn) const
  {
    // Actual number of expected tokens
    int yycount = 0;

    const int yyn = yypact_[+yyparser_.yystack_[0].state];
    if (!yy_pact_value_is_default_ (yyn))
      {
        /* Start YYX at -YYN if negative to avoid negative indexes in
           YYCHECK.  In other words, skip the first -YYN actions for
           this state because they are default actions.  */
        const int yyxbegin = yyn < 0 ? -yyn : 0;
        // Stay within bounds of both yycheck and yytname.
        const int yychecklim = yylast_ - yyn + 1;
        const int yyxend = yychecklim < YYNTOKENS ? yychecklim : YYNTOKENS;
        for (int yyx = yyxbegin; yyx < yyxend; ++yyx)
          if (yycheck_[yyx + yyn] == yyx && yyx != symbol_kind::S_YYerror
              && !yy_table_value_is_error_ (yytable_[yyx + yyn]))
            {
              if (!yyarg)
                ++yycount;
              else if (yycount == yyargn)
                return 0;
              else
                yyarg[yycount++] = YY_CAST (symbol_kind_type, yyx);
            }
      }

    if (yyarg && yycount == 0 && 0 < yyargn)
      yyarg[0] = symbol_kind::S_YYEMPTY;
    return yycount;
  }